

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::OptionalSemicolon(SQCompiler *this)

{
  bool bVar1;
  SQCompiler *in_RDI;
  
  if (in_RDI->_token == 0x3b) {
    Lex(in_RDI);
  }
  else {
    bVar1 = IsEndOfStatement(in_RDI);
    if (!bVar1) {
      Error(in_RDI,"end of statement expected (; or lf)");
    }
  }
  return;
}

Assistant:

void OptionalSemicolon()
    {
        if(_token == _SC(';')) { Lex(); return; }
        if(!IsEndOfStatement()) {
            Error(_SC("end of statement expected (; or lf)"));
        }
    }